

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  undefined1 auVar1 [16];
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 size;
  ImVec2 offset;
  ImVec2 uv [4];
  ImVec2 local_d0;
  ImU32 local_c8;
  ImU32 local_c4;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [8];
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 local_78;
  ImVec2 IStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (mouse_cursor != -1) {
    local_c0 = pos;
    if (8 < (uint)mouse_cursor) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_draw.cpp"
                    ,0xd6c,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    local_b0.x = 0.0;
    local_b0.y = 0.0;
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    local_78.x = 0.0;
    local_78.y = 0.0;
    IStack_70.x = 0.0;
    IStack_70.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    bVar2 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_b0,&local_b8,&local_88,&local_78);
    if (bVar2) {
      fVar4 = local_c0.x - local_b0.x;
      fVar3 = local_c0.y - local_b0.y;
      local_c0.y = fVar3;
      local_c0.x = fVar4;
      texture_id = this->TexID;
      local_c4 = col_fill;
      ImDrawList::PushTextureID(draw_list,texture_id);
      fVar5 = scale * 0.0 + fVar3;
      local_58 = ZEXT416((uint)fVar5);
      local_d0.y = fVar5;
      local_d0.x = fVar4 + scale;
      _local_a8 = ZEXT416((uint)local_b8.x);
      local_48 = ZEXT416((uint)local_b8.y);
      fVar5 = (local_b8.y + 0.0) * scale + fVar3;
      local_68 = ZEXT416((uint)fVar5);
      local_90.y = fVar5;
      local_90.x = (local_b8.x + 1.0) * scale + fVar4;
      local_c8 = col_border;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_90,&local_78,&IStack_70,col_shadow)
      ;
      local_d0.y = (float)local_58._0_4_;
      local_d0.x = scale + scale + fVar4;
      local_90.y = (float)local_68._0_4_;
      local_90.x = ((float)local_a8._0_4_ + 2.0) * scale + fVar4;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_90,&local_78,&IStack_70,col_shadow)
      ;
      uStack_a0 = local_a8._4_4_;
      local_a8._0_4_ = (float)local_a8._0_4_ * scale + fVar4;
      local_a8._4_4_ = (float)local_48._0_4_ * scale + fVar3;
      uStack_9c = local_48._4_4_;
      local_d0.y = (float)local_a8._4_4_;
      local_d0.x = (float)local_a8._0_4_;
      ImDrawList::AddImage(draw_list,texture_id,&local_c0,&local_d0,&local_78,&IStack_70,local_c8);
      auVar1 = _local_a8;
      local_d0.x = (float)local_a8._0_4_;
      local_d0.y = (float)local_a8._4_4_;
      _local_a8 = auVar1;
      ImDrawList::AddImage(draw_list,texture_id,&local_c0,&local_d0,&local_88,&IStack_80,local_c4);
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1, 0) * scale, pos + (ImVec2(1, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2, 0) * scale, pos + (ImVec2(2, 0) + size) * scale,    uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                        pos + size * scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}